

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

void __thiscall
duckdb::Prefix::Prefix
          (Prefix *this,unsafe_unique_ptr<FixedSizeAllocator> *allocator,Node ptr_p,idx_t count)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  idx_t iVar3;
  iterator iVar4;
  pointer this_00;
  data_ptr_t pdVar5;
  ulong local_28;
  
  _Var1._M_head_impl =
       (allocator->
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_28 = (ulong)ptr_p.super_IndexPointer.data & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var1._M_head_impl)->buffers)._M_h,&local_28);
  this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
            ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                          *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                   ._M_cur + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this_00,true);
  iVar2 = (_Var1._M_head_impl)->segment_size;
  iVar3 = (_Var1._M_head_impl)->bitmask_offset;
  this->data = pdVar5 + iVar3 + (ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) * iVar2;
  this->ptr = (Node *)(pdVar5 + iVar3 + (ptr_p.super_IndexPointer.data._4_4_ & 0xffffff) * iVar2 +
                      count + 1);
  this->in_memory = true;
  return;
}

Assistant:

Prefix::Prefix(unsafe_unique_ptr<FixedSizeAllocator> &allocator, const Node ptr_p, const idx_t count) {
	data = allocator->Get(ptr_p, true);
	ptr = reinterpret_cast<Node *>(data + count + 1);
	in_memory = true;
}